

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O2

void __thiscall fp::Algorithm::SetDefaults(Algorithm *this)

{
  this->temp_goal_ = false;
  API::clearAllColor();
  API::setColor(0,0,'g');
  API::setColor((this->goal1_)._M_elems[1],0xf - (this->goal1_)._M_elems[0],'w');
  API::setColor((this->goal2_)._M_elems[1],0xf - (this->goal2_)._M_elems[0],'w');
  API::setColor((this->goal3_)._M_elems[1],0xf - (this->goal3_)._M_elems[0],'w');
  API::setColor((this->goal4_)._M_elems[1],0xf - (this->goal4_)._M_elems[0],'w');
  return;
}

Assistant:

void fp::Algorithm::SetDefaults() {
    this->temp_goal_ = false;
    fp::API::clearAllColor();
    fp::API::setColor(0, 0, 'g');
    fp::API::setColor(this->goal1_[1], 15 - this->goal1_[0], 'w');
    fp::API::setColor(this->goal2_[1], 15 - this->goal2_[0], 'w');
    fp::API::setColor(this->goal3_[1], 15 - this->goal3_[0], 'w');
    fp::API::setColor(this->goal4_[1], 15 - this->goal4_[0], 'w');
}